

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O0

int64_t __thiscall
aeron::DriverProxy::addExclusivePublication(DriverProxy *this,string *channel,int32_t streamId)

{
  int64_t iVar1;
  undefined8 *in_RDI;
  int64_t correlationId;
  anon_class_32_4_8d18ef1a *in_stack_000002a8;
  DriverProxy *in_stack_000002b0;
  
  iVar1 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    ((ManyToOneRingBuffer *)*in_RDI);
  writeCommandToDriver<aeron::DriverProxy::addExclusivePublication(std::__cxx11::string_const&,int)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (in_stack_000002b0,in_stack_000002a8);
  return iVar1;
}

Assistant:

std::int64_t addExclusivePublication(const std::string& channel, std::int32_t streamId)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            PublicationMessageFlyweight publicationMessage(buffer, 0);

            publicationMessage.clientId(m_clientId);
            publicationMessage.correlationId(correlationId);
            publicationMessage.streamId(streamId);
            publicationMessage.channel(channel);

            length = publicationMessage.length();

            return ControlProtocolEvents::ADD_EXCLUSIVE_PUBLICATION;
        });

        return correlationId;
    }